

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

void __thiscall GlobOptBlockData::SetChangedSym(GlobOptBlockData *this,Sym *sym)

{
  StackSym *pSVar1;
  
  if ((sym != (Sym *)0x0) && (sym->m_kind == SymKindStack)) {
    pSVar1 = Sym::AsStackSym(sym);
    if ((pSVar1->field_0x19 & 0x20) != 0) {
      SetChangedSym(this,sym->m_id);
      return;
    }
  }
  return;
}

Assistant:

void
GlobOptBlockData::SetChangedSym(Sym* sym)
{
    if (sym && sym->IsStackSym() && sym->AsStackSym()->HasByteCodeRegSlot())
    {
        SetChangedSym(sym->m_id);
    }
}